

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test::
TestBody(DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test *this)

{
  bool bVar1;
  pointer pTVar2;
  char *pcVar3;
  Field *this_00;
  RepeatedPtrField<google::protobuf::Option> *options;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar4;
  char *in_R9;
  string_view name;
  string local_1d0;
  AssertHelper local_1b0;
  Message local_1a8;
  string_view local_1a0;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__1;
  size_t local_128;
  Field *field;
  string local_110;
  AssertHelper local_f0;
  Message local_e8 [3];
  string local_d0 [32];
  Status local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  Type type;
  DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test *this_local;
  
  Type::Type((Type *)&gtest_ar_.message_);
  pTVar2 = std::
           unique_ptr<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ::operator->(&(this->super_DescriptorPoolTypeResolverTest).resolver_);
  GetTypeUrl<proto2_unittest::TestMessageWithCustomOptions>();
  puVar4 = &gtest_ar_.message_;
  (*pTVar2->_vptr_TypeResolver[2])(&local_b0,pTVar2,local_d0);
  local_a1 = absl::lts_20250127::Status::ok(&local_b0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  absl::lts_20250127::Status::~Status(&local_b0);
  std::__cxx11::string::~string(local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)local_a0,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType( GetTypeUrl<proto2_unittest::TestMessageWithCustomOptions>(), &type) .ok()"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    puVar4 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x166;
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x166,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,"field1");
    name._M_str = (char *)puVar4;
    name._M_len = local_128;
    this_00 = FindField((anon_unknown_0 *)&gtest_ar_.message_,
                        (Type *)gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,name);
    local_141 = this_00 != (Field *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_140,&local_141,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_140,(AssertionResult *)0x1e0795f,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x168,pcVar3);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_150);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    if (bVar1) {
      options = Field::options(this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1a0,"proto2_unittest.field_opt1");
      local_189 = HasUInt64Option(options,local_1a0,0x20a75e12d);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_188,&local_189,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1d0,(internal *)local_188,
                   (AssertionResult *)
                   "HasUInt64Option(field->options(), \"proto2_unittest.field_opt1\", 8765432109)",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                   ,0x16a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        testing::Message::~Message(&local_1a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    }
  }
  Type::~Type((Type *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestCustomFieldOptions) {
  Type type;
  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(
              GetTypeUrl<proto2_unittest::TestMessageWithCustomOptions>(),
              &type)
          .ok());
  const Field* field = FindField(type, "field1");
  ASSERT_TRUE(field != nullptr);
  EXPECT_TRUE(HasUInt64Option(field->options(), "proto2_unittest.field_opt1",
                              8765432109));
}